

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minAbsNzo(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,bool unscaled)

{
  long *plVar1;
  type_conflict5 tVar2;
  int iVar3;
  byte in_DL;
  cpp_dec_float<50U,_int,_void> *in_RSI;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDI;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000008;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  m_1;
  int i_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  m;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *mini;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  int iVar4;
  undefined4 in_stack_ffffffffffffff14;
  undefined1 local_cc [56];
  int local_94;
  undefined1 local_90 [56];
  int local_58;
  byte local_51;
  undefined8 local_40;
  undefined8 local_38;
  undefined1 *local_28;
  undefined1 *local_18;
  undefined8 local_8;
  
  local_51 = in_DL & 1;
  local_38 = infinity();
  local_40 = 0;
  local_8 = local_38;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_RSI,(double)in_RDI,
             (type *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  if (((local_51 & 1) == 0) || ((in_RSI[8].data._M_elems[3] & 1) == 0)) {
    local_94 = 0;
    while (iVar4 = local_94,
          iVar3 = nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x2ff5e5), iVar4 < iVar3) {
      colVector((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_stack_ffffffffffffff14,iVar4),in_stack_ffffffffffffff0c);
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::minAbs(in_stack_00000008);
      tVar2 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x2ff619);
      if (tVar2) {
        local_28 = local_cc;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)CONCAT44(in_stack_ffffffffffffff14,iVar4),
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      }
      local_94 = local_94 + 1;
    }
  }
  else {
    local_58 = 0;
    while (iVar4 = local_58,
          iVar3 = nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x2ff53f), iVar4 < iVar3) {
      plVar1 = *(long **)(in_RSI[8].data._M_elems + 4);
      (**(code **)(*plVar1 + 0x98))(local_90,plVar1,in_RSI,local_58);
      tVar2 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x2ff579);
      if (tVar2) {
        local_18 = local_90;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)CONCAT44(iVar4,in_stack_ffffffffffffff10),
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      }
      local_58 = local_58 + 1;
    }
  }
  return in_RDI;
}

Assistant:

inline
R SPxLPBase<R>::minAbsNzo(bool unscaled) const
{
   R mini = R(infinity);

   if(unscaled && _isScaled)
   {
      assert(lp_scaler != nullptr);

      for(int i = 0; i < nCols(); ++i)
      {
         R m = lp_scaler->getColMinAbsUnscaled(*this, i);

         if(m < mini)
            mini = m;
      }
   }
   else
   {
      for(int i = 0; i < nCols(); ++i)
      {
         R m = colVector(i).minAbs();

         if(m < mini)
            mini = m;
      }
   }

   assert(mini >= 0.0);

   return mini;
}